

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralConvexShape.cpp
# Opt level: O2

void __thiscall
cbtPolyhedralConvexAabbCachingShape::recalcLocalAabb(cbtPolyhedralConvexAabbCachingShape *this)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  float *pfVar5;
  float local_78 [26];
  
  pfVar5 = local_78;
  this->m_isLocalAabbValid = true;
  if (recalcLocalAabb()::_directions == '\0') {
    iVar3 = __cxa_guard_acquire(&recalcLocalAabb()::_directions);
    if (iVar3 != 0) {
      recalcLocalAabb::_directions[0].m_floats[0] = 1.0;
      recalcLocalAabb::_directions[0].m_floats[1] = 0.0;
      recalcLocalAabb::_directions[0].m_floats[2] = 0.0;
      recalcLocalAabb::_directions[0].m_floats[3] = 0.0;
      recalcLocalAabb::_directions[1].m_floats[0] = 0.0;
      recalcLocalAabb::_directions[1].m_floats[1] = 1.0;
      recalcLocalAabb::_directions[1].m_floats[2] = 0.0;
      recalcLocalAabb::_directions[1].m_floats[3] = 0.0;
      recalcLocalAabb::_directions[2].m_floats[0] = 0.0;
      recalcLocalAabb::_directions[2].m_floats[1] = 0.0;
      recalcLocalAabb::_directions[2].m_floats._8_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      recalcLocalAabb::_directions[3].m_floats[0] = -1.0;
      recalcLocalAabb::_directions[3].m_floats[1] = 0.0;
      recalcLocalAabb::_directions[3].m_floats[2] = 0.0;
      recalcLocalAabb::_directions[3].m_floats[3] = 0.0;
      recalcLocalAabb::_directions[4].m_floats[0] = 0.0;
      recalcLocalAabb::_directions[4].m_floats[1] = -1.0;
      recalcLocalAabb::_directions[4].m_floats[2] = 0.0;
      recalcLocalAabb::_directions[4].m_floats[3] = 0.0;
      recalcLocalAabb::_directions[5].m_floats[0] = 0.0;
      recalcLocalAabb::_directions[5].m_floats[1] = 0.0;
      recalcLocalAabb::_directions[5].m_floats._8_8_ = vmovlps_avx(SUB6416(ZEXT464(0xbf800000),0));
      __cxa_guard_release(&recalcLocalAabb()::_directions);
    }
  }
  local_78[0x10] = 0.0;
  local_78[0x11] = 0.0;
  local_78[0x12] = 0.0;
  local_78[0x13] = 0.0;
  local_78[0x14] = 0.0;
  local_78[0x15] = 0.0;
  local_78[0x16] = 0.0;
  local_78[0x17] = 0.0;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  local_78[3] = 0.0;
  local_78[4] = 0.0;
  local_78[5] = 0.0;
  local_78[6] = 0.0;
  local_78[7] = 0.0;
  local_78[8] = 0.0;
  local_78[9] = 0.0;
  local_78[10] = 0.0;
  local_78[0xb] = 0.0;
  local_78[0xc] = 0.0;
  local_78[0xd] = 0.0;
  local_78[0xe] = 0.0;
  local_78[0xf] = 0.0;
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0x13])
            (this,recalcLocalAabb::_directions,local_78,6);
  fVar2 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.m_collisionMargin;
  for (lVar4 = -0xc; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(float *)((long)(this->m_localAabbMax).m_floats + lVar4 + 0xc) = fVar2 + *pfVar5;
    pfVar1 = pfVar5 + 0xc;
    pfVar5 = pfVar5 + 5;
    *(float *)((long)(this->m_localAabbMin).m_floats + lVar4 + 0xc) = *pfVar1 - fVar2;
  }
  return;
}

Assistant:

void cbtPolyhedralConvexAabbCachingShape::recalcLocalAabb()
{
	m_isLocalAabbValid = true;

#if 1
	static const cbtVector3 _directions[] =
		{
			cbtVector3(1., 0., 0.),
			cbtVector3(0., 1., 0.),
			cbtVector3(0., 0., 1.),
			cbtVector3(-1., 0., 0.),
			cbtVector3(0., -1., 0.),
			cbtVector3(0., 0., -1.)};

	cbtVector3 _supporting[] =
		{
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.),
			cbtVector3(0., 0., 0.)};

	batchedUnitVectorGetSupportingVertexWithoutMargin(_directions, _supporting, 6);

	for (int i = 0; i < 3; ++i)
	{
		m_localAabbMax[i] = _supporting[i][i] + m_collisionMargin;
		m_localAabbMin[i] = _supporting[i + 3][i] - m_collisionMargin;
	}

#else

	for (int i = 0; i < 3; i++)
	{
		cbtVector3 vec(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
		vec[i] = cbtScalar(1.);
		cbtVector3 tmp = localGetSupportingVertex(vec);
		m_localAabbMax[i] = tmp[i];
		vec[i] = cbtScalar(-1.);
		tmp = localGetSupportingVertex(vec);
		m_localAabbMin[i] = tmp[i];
	}
#endif
}